

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O3

void fmt_PrintNumber(char *buf,size_t bufLen,FormatSpec *fmt,uint32_t value)

{
  byte bVar1;
  size_t __n;
  char *__format;
  char cVar2;
  ulong uVar3;
  int32_t v;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  size_t __n_00;
  bool bVar7;
  double dVar8;
  char valueBuf [262];
  char local_14c;
  undefined8 local_140;
  byte local_138 [264];
  
  uVar5 = fmt->type;
  if (((0x20 < uVar5 - 0x58) || ((0x100800401U >> ((ulong)(uVar5 - 0x58) & 0x3f) & 1) == 0)) &&
     (fmt->prefix == true)) {
    error("Formatting type \'%c\' with prefix flag \'#\'\n");
    uVar5 = fmt->type;
  }
  if (uVar5 == 0x66) {
    cVar2 = (char)fmt->sign;
    uVar5 = 0x66;
LAB_0010b43a:
    if (0x80000000 < value) {
      value = -value;
      cVar2 = '-';
    }
  }
  else {
    if (fmt->hasFrac == true) {
      error("Formatting type \'%c\' with fractional width\n");
      uVar5 = fmt->type;
    }
    if (uVar5 == 0x73) {
      error("Formatting number as type \'s\'\n");
      uVar5 = fmt->type;
    }
    cVar2 = (char)fmt->sign;
    if ((uVar5 | 2) == 0x66) goto LAB_0010b43a;
  }
  if (fmt->prefix == true) {
    local_14c = '$';
    if (uVar5 == 0x58) goto LAB_0010b480;
    if (uVar5 != 0x62) {
      if ((uVar5 != 0x78) && (local_14c = '&', uVar5 != 0x6f)) {
        local_14c = '\0';
      }
      goto LAB_0010b480;
    }
    local_14c = '%';
LAB_0010b57d:
    uVar6 = (ulong)value;
    uVar4 = 0xffffffffffffffff;
    do {
      uVar3 = uVar4;
      local_138[uVar3 + 1] = (byte)value & 1 | 0x30;
      uVar6 = uVar6 >> 1;
      uVar4 = uVar3 + 1;
      bVar7 = 1 < value;
      value = (uint)uVar6;
    } while (bVar7);
    local_138[uVar3 + 2] = 0;
    if (uVar4 != 0) {
      uVar6 = 1;
      do {
        bVar1 = local_138[uVar6 - 1];
        local_138[uVar6 - 1] = local_138[uVar4];
        local_138[uVar4] = bVar1;
        uVar4 = uVar4 - 1;
        bVar7 = uVar6 < uVar4;
        uVar6 = uVar6 + 1;
      } while (bVar7);
    }
  }
  else {
    local_14c = '\0';
LAB_0010b480:
    if ((int)uVar5 < 0x66) {
      if (uVar5 == 0x58) {
        __format = "%X";
      }
      else {
        if (uVar5 == 0x62) goto LAB_0010b57d;
        if (uVar5 == 100) {
          __format = "%d";
        }
        else {
LAB_0010b5d4:
          __format = "%d";
          if (uVar5 == 0x6f) {
            __format = "%o";
          }
        }
      }
    }
    else {
      if (uVar5 == 0x66) {
        uVar6 = 5;
        if ((fmt->hasFrac == true) && (uVar6 = fmt->fracWidth, 0xff < uVar6)) {
          error("Fractional width %zu too long, limiting to 255\n",uVar6);
          uVar6 = 0xff;
        }
        local_140 = (double)value;
        dVar8 = fix_PrecisionFactor();
        snprintf((char *)local_138,0x106,"%.*f",local_140 / dVar8,uVar6 & 0xffffffff);
        goto LAB_0010b60d;
      }
      if (uVar5 == 0x75) {
        __format = "%u";
      }
      else {
        if (uVar5 != 0x78) goto LAB_0010b5d4;
        __format = "%x";
      }
    }
    snprintf((char *)local_138,0x106,__format,(ulong)value);
  }
LAB_0010b60d:
  __n = strlen((char *)local_138);
  uVar4 = (((ulong)(local_14c != '\0') + 1) - (ulong)(cVar2 == '\0')) + __n;
  uVar6 = fmt->width;
  if (fmt->width <= uVar4) {
    uVar6 = uVar4;
  }
  uVar3 = bufLen - 1;
  if ((uVar3 < uVar6) && (error("Formatted numeric value too long\n"), uVar6 = uVar3, uVar3 < uVar4)
     ) {
    __n = (__n + uVar3) - uVar4;
    uVar4 = uVar3;
  }
  if ((((__n <= uVar4) && (__n_00 = uVar6 - uVar4, uVar4 <= uVar6)) && (uVar4 < bufLen)) &&
     (uVar6 < bufLen)) {
    if (fmt->alignLeft == true) {
      if (cVar2 != '\0') {
        *buf = cVar2;
      }
      uVar4 = (ulong)(cVar2 != '\0');
      if (local_14c != '\0') {
        buf[uVar4] = local_14c;
        uVar4 = uVar4 + 1;
      }
      memcpy(buf + uVar4,local_138,__n);
      uVar4 = uVar4 + __n;
      if (uVar4 < uVar6) {
        memset(buf + uVar4,0x20,uVar6 - uVar4);
      }
    }
    else {
      if (fmt->padZero == false) {
        if (uVar6 == uVar4) {
          uVar3 = 0;
        }
        else {
          memset(buf,0x20,__n_00);
          uVar3 = __n_00;
        }
        if (cVar2 != '\0') {
          buf[uVar3] = cVar2;
          uVar3 = uVar3 + 1;
        }
        if (local_14c != '\0') {
          buf[uVar3] = local_14c;
          uVar3 = uVar3 + 1;
        }
      }
      else {
        if (cVar2 != '\0') {
          *buf = cVar2;
        }
        uVar3 = (ulong)(cVar2 != '\0');
        if (local_14c != '\0') {
          buf[uVar3] = local_14c;
          uVar3 = uVar3 + 1;
        }
        if (uVar6 != uVar4) {
          memset(buf + uVar3,0x30,__n_00);
          uVar3 = (uVar3 + uVar6) - uVar4;
        }
      }
      memcpy(buf + uVar3,local_138,__n);
    }
    buf[uVar6] = '\0';
    return;
  }
  __assert_fail("numLen < bufLen && totalLen < bufLen && numLen <= totalLen && len <= numLen",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/format.cpp"
                ,0x101,"void fmt_PrintNumber(char *, size_t, const struct FormatSpec *, uint32_t)");
}

Assistant:

void fmt_PrintNumber(char *buf, size_t bufLen, struct FormatSpec const *fmt, uint32_t value)
{
	if (fmt->type != 'X' && fmt->type != 'x' && fmt->type != 'b' && fmt->type != 'o'
	    && fmt->prefix)
		error("Formatting type '%c' with prefix flag '#'\n", fmt->type);
	if (fmt->type != 'f' && fmt->hasFrac)
		error("Formatting type '%c' with fractional width\n", fmt->type);
	if (fmt->type == 's')
		error("Formatting number as type 's'\n");

	char sign = fmt->sign; // 0 or ' ' or '+'

	if (fmt->type == 'd' || fmt->type == 'f') {
		int32_t v = value;

		if (v < 0 && v != INT32_MIN) {
			sign = '-';
			value = -v;
		}
	}

	char prefix = !fmt->prefix ? 0
		: fmt->type == 'X' ? '$'
		: fmt->type == 'x' ? '$'
		: fmt->type == 'b' ? '%'
		: fmt->type == 'o' ? '&'
		: 0;

	char valueBuf[262]; // Max 5 digits + decimal + 255 fraction digits + terminator

	if (fmt->type == 'b') {
		// Special case for binary
		char *ptr = valueBuf;

		do {
			*ptr++ = (value & 1) + '0';
			value >>= 1;
		} while (value);

		*ptr = '\0';

		// Reverse the digits
		size_t valueLen = ptr - valueBuf;

		for (size_t i = 0, j = valueLen - 1; i < j; i++, j--) {
			char c = valueBuf[i];

			valueBuf[i] = valueBuf[j];
			valueBuf[j] = c;
		}
	} else if (fmt->type == 'f') {
		// Special case for fixed-point

		// Default fractional width (C's is 6 for "%f"; here 5 is enough for Q16.16)
		size_t fracWidth = fmt->hasFrac ? fmt->fracWidth : 5;

		if (fracWidth > 255) {
			error("Fractional width %zu too long, limiting to 255\n",
			      fracWidth);
			fracWidth = 255;
		}

		snprintf(valueBuf, sizeof(valueBuf), "%.*f", (int)fracWidth,
			 value / fix_PrecisionFactor());
	} else {
		char const *spec = fmt->type == 'd' ? "%" PRId32
				 : fmt->type == 'u' ? "%" PRIu32
				 : fmt->type == 'X' ? "%" PRIX32
				 : fmt->type == 'x' ? "%" PRIx32
				 : fmt->type == 'o' ? "%" PRIo32
				 : "%" PRId32;

		snprintf(valueBuf, sizeof(valueBuf), spec, value);
	}

	size_t len = strlen(valueBuf);
	size_t numLen = (sign != 0) + (prefix != 0) + len;
	size_t totalLen = fmt->width > numLen ? fmt->width : numLen;

	if (totalLen > bufLen - 1) { // bufLen includes terminator
		error("Formatted numeric value too long\n");
		totalLen = bufLen - 1;
		if (numLen > totalLen) {
			len -= numLen - totalLen;
			numLen = totalLen;
		}
	}
	assert(numLen < bufLen && totalLen < bufLen && numLen <= totalLen && len <= numLen);

	size_t padLen = totalLen - numLen;
	size_t pos = 0;

	if (fmt->alignLeft) {
		if (sign)
			buf[pos++] = sign;
		if (prefix)
			buf[pos++] = prefix;
		memcpy(buf + pos, valueBuf, len);
		for (size_t i = pos + len; i < totalLen; i++)
			buf[i] = ' ';
	} else {
		if (fmt->padZero) {
			// sign, then prefix, then zero padding
			if (sign)
				buf[pos++] = sign;
			if (prefix)
				buf[pos++] = prefix;
			for (size_t i = 0; i < padLen; i++)
				buf[pos++] = '0';
		} else {
			// space padding, then sign, then prefix
			for (size_t i = 0; i < padLen; i++)
				buf[pos++] = ' ';
			if (sign)
				buf[pos++] = sign;
			if (prefix)
				buf[pos++] = prefix;
		}
		memcpy(buf + pos, valueBuf, len);
	}

	buf[totalLen] = '\0';
}